

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_>::dx
          (FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_> *this,int i)

{
  undefined4 in_EDX;
  Fad<double> *in_RSI;
  value_type *in_RDI;
  Fad<Fad<double>_> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  Fad<double> *this_00;
  
  this_00 = in_RSI;
  Fad<Fad<double>_>::dx(in_stack_ffffffffffffffb0,(int)((ulong)in_RSI >> 0x20));
  FadCst<int>::val((FadCst<int> *)&in_RSI->dx_);
  operator*<Fad<double>,_int,_nullptr>
            ((Fad<double> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<int>>>
            (this_00,(FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> *)
                     CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> *)in_RDI);
  return in_RDI;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val();}